

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_profile_aa.cpp
# Opt level: O0

void __thiscall
agg::line_profile_aa::set(line_profile_aa *this,double center_width,double smoother_width)

{
  line_profile_aa lVar1;
  uint uVar2;
  value_type *pvVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  uint n_smoother;
  uint val;
  uint i;
  value_type *ch_smoother;
  value_type *ch_center;
  uint subpixel_smoother_width;
  uint subpixel_center_width;
  value_type *ch;
  double k;
  double width;
  double base_val;
  double smoother_width_local;
  double center_width_local;
  line_profile_aa *this_local;
  
  width = 1.0;
  smoother_width_local = center_width;
  if ((center_width == 0.0) && (!NAN(center_width))) {
    smoother_width_local = 0.00390625;
  }
  base_val = smoother_width;
  if ((smoother_width == 0.0) && (!NAN(smoother_width))) {
    base_val = 0.00390625;
  }
  if (smoother_width_local + base_val < *(double *)(this + 0x118)) {
    dVar6 = (smoother_width_local + base_val) / *(double *)(this + 0x118);
    width = dVar6 * 1.0;
    smoother_width_local = smoother_width_local / dVar6;
    base_val = base_val / dVar6;
  }
  pvVar3 = profile(this,smoother_width_local + base_val);
  uVar4 = (uint)(long)(smoother_width_local * 256.0);
  uVar5 = (uint)(long)(base_val * 256.0);
  ch_smoother = pvVar3 + 0x200;
  lVar1 = this[((long)(width * 255.0) & 0xffffffffU) + 0x10];
  _subpixel_smoother_width = (line_profile_aa *)ch_smoother;
  for (n_smoother = 0; n_smoother < uVar4; n_smoother = n_smoother + 1) {
    *_subpixel_smoother_width = lVar1;
    _subpixel_smoother_width = _subpixel_smoother_width + 1;
  }
  _val = (line_profile_aa *)ch_smoother + ((long)(smoother_width_local * 256.0) & 0xffffffff);
  for (n_smoother = 0; n_smoother < uVar5; n_smoother = n_smoother + 1) {
    *_val = this[((long)((width - width * ((double)n_smoother /
                                          (double)((long)(base_val * 256.0) & 0xffffffff))) * 255.0)
                 & 0xffffffffU) + 0x10];
    _val = _val + 1;
  }
  uVar2 = profile_size(this);
  lVar1 = this[0x10];
  for (n_smoother = 0; n_smoother < ((uVar2 - uVar5) - uVar4) - 0x200; n_smoother = n_smoother + 1)
  {
    *_val = lVar1;
    _val = _val + 1;
  }
  _subpixel_smoother_width = (line_profile_aa *)ch_smoother;
  for (n_smoother = 0; n_smoother < 0x200; n_smoother = n_smoother + 1) {
    _subpixel_smoother_width[-1] = (line_profile_aa)*ch_smoother;
    ch_smoother = ch_smoother + 1;
    _subpixel_smoother_width = _subpixel_smoother_width + -1;
  }
  return;
}

Assistant:

void line_profile_aa::set(double center_width, double smoother_width)
    {
        double base_val = 1.0;
        if(center_width == 0.0)   center_width = 1.0 / subpixel_scale;
        if(smoother_width == 0.0) smoother_width = 1.0 / subpixel_scale;

        double width = center_width + smoother_width;
        if(width < m_min_width)
        {
            double k = width / m_min_width;
            base_val *= k;
            center_width /= k;
            smoother_width /= k;
        }

        value_type* ch = profile(center_width + smoother_width);

        unsigned subpixel_center_width = unsigned(center_width * subpixel_scale);
        unsigned subpixel_smoother_width = unsigned(smoother_width * subpixel_scale);

        value_type* ch_center   = ch + subpixel_scale*2;
        value_type* ch_smoother = ch_center + subpixel_center_width;

        unsigned i;

        unsigned val = m_gamma[unsigned(base_val * aa_mask)];
        ch = ch_center;
        for(i = 0; i < subpixel_center_width; i++)
        {
            *ch++ = (value_type)val;
        }

        for(i = 0; i < subpixel_smoother_width; i++)
        {
            *ch_smoother++ = 
                m_gamma[unsigned((base_val - 
                                  base_val * 
                                  (double(i) / subpixel_smoother_width)) * aa_mask)];
        }

        unsigned n_smoother = profile_size() - 
                              subpixel_smoother_width - 
                              subpixel_center_width - 
                              subpixel_scale*2;

        val = m_gamma[0];
        for(i = 0; i < n_smoother; i++)
        {
            *ch_smoother++ = (value_type)val;
        }

        ch = ch_center;
        for(i = 0; i < subpixel_scale*2; i++)
        {
            *--ch = *ch_center++;
        }
    }